

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall Catch::Matchers::MatcherGenericBase::~MatcherGenericBase(MatcherGenericBase *this)

{
  (this->super_MatcherUntypedBase)._vptr_MatcherUntypedBase =
       (_func_int **)&PTR__MatcherUntypedBase_001aa818;
  std::__cxx11::string::~string((string *)&(this->super_MatcherUntypedBase).m_cachedToString);
  return;
}

Assistant:

MatcherGenericBase::~MatcherGenericBase() = default;